

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O3

void __thiscall ON_SimpleArray<ON_2fPoint>::Append(ON_SimpleArray<ON_2fPoint> *this,ON_2fPoint *x)

{
  int iVar1;
  uint uVar2;
  ON_2fPoint *memblock;
  long lVar3;
  uint uVar4;
  
  uVar2 = this->m_count;
  lVar3 = (long)(int)uVar2;
  if (uVar2 == this->m_capacity) {
    if ((int)uVar2 < 8 || (ulong)(lVar3 * 8) < 0x10000001) {
      uVar4 = 4;
      if (2 < (int)uVar2) {
        uVar4 = uVar2 * 2;
      }
    }
    else {
      uVar4 = 0x2000008;
      if (uVar2 < 0x2000008) {
        uVar4 = uVar2;
      }
      uVar4 = uVar4 + uVar2;
    }
    memblock = x;
    if (x < this->m_a + lVar3 && this->m_a <= x) {
      memblock = (ON_2fPoint *)onmalloc(8);
      *memblock = *x;
      uVar2 = this->m_capacity;
    }
    if (uVar2 < uVar4) {
      SetCapacity(this,(long)(int)uVar4);
    }
    if (this->m_a == (ON_2fPoint *)0x0) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_array_defs.h"
                 ,0x1f0,"","allocation failure");
      return;
    }
    iVar1 = this->m_count;
    this->m_count = iVar1 + 1;
    this->m_a[iVar1] = *memblock;
    if (memblock != x) {
      onfree(memblock);
      return;
    }
  }
  else {
    this->m_count = uVar2 + 1;
    this->m_a[lVar3] = *x;
  }
  return;
}

Assistant:

void ON_SimpleArray<T>::Append( const T& x ) 
{
  const T* p = &x;
  if ( m_count == m_capacity ) 
  {
    const int newcapacity = NewCapacity();
    if ( p >= m_a && p < (m_a + m_capacity) )
    {
      // 26 Sep 2005 Dale Lear
      // x is in the block of memory about to be reallocated.
      void* temp = onmalloc(sizeof(T));
      memcpy(temp, (void*)p, sizeof(T));
      p = (T*)temp;
    }
    Reserve(newcapacity);
    if (nullptr == m_a)
    {
      ON_ERROR("allocation failure");
      return;
    }
  }
  m_a[m_count++] = *p;
  if (p != &x)
    onfree((void*)p);
}